

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

int Curl_hash_init(curl_hash *h,int slots,hash_function hfunc,comp_function comparator,
                  curl_hash_dtor dtor)

{
  curl_llist **ppcVar1;
  curl_llist *pcVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = 1;
  if ((dtor != (curl_hash_dtor)0x0 && comparator != (comp_function)0x0) &&
      (hfunc != (hash_function)0x0 && slots != 0)) {
    h->hash_func = hfunc;
    h->comp_func = comparator;
    h->dtor = dtor;
    h->size = 0;
    h->slots = slots;
    ppcVar1 = (curl_llist **)(*Curl_cmalloc)((long)slots << 3);
    h->table = ppcVar1;
    if (ppcVar1 == (curl_llist **)0x0) {
LAB_00577f55:
      h->slots = 0;
    }
    else {
      if (0 < slots) {
        lVar4 = 0;
        do {
          pcVar2 = Curl_llist_alloc(hash_element_dtor);
          *(curl_llist **)((long)h->table + lVar4) = pcVar2;
          ppcVar1 = h->table;
          if (*(long *)((long)ppcVar1 + lVar4) == 0) {
            if (lVar4 != 0) {
              do {
                Curl_llist_destroy(*(curl_llist **)((long)h->table + lVar4 + -8),(void *)0x0);
                *(undefined8 *)((long)h->table + lVar4 + -8) = 0;
                lVar4 = lVar4 + -8;
              } while (lVar4 != 0);
              ppcVar1 = h->table;
            }
            (*Curl_cfree)(ppcVar1);
            h->table = (curl_llist **)0x0;
            goto LAB_00577f55;
          }
          lVar4 = lVar4 + 8;
        } while ((ulong)(uint)slots << 3 != lVar4);
      }
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int
Curl_hash_init(struct curl_hash *h,
               int slots,
               hash_function hfunc,
               comp_function comparator,
               curl_hash_dtor dtor)
{
  int i;

  if(!slots || !hfunc || !comparator ||!dtor) {
    return 1; /* failure */
  }

  h->hash_func = hfunc;
  h->comp_func = comparator;
  h->dtor = dtor;
  h->size = 0;
  h->slots = slots;

  h->table = malloc(slots * sizeof(struct curl_llist *));
  if(h->table) {
    for(i = 0; i < slots; ++i) {
      h->table[i] = Curl_llist_alloc((curl_llist_dtor) hash_element_dtor);
      if(!h->table[i]) {
        while(i--) {
          Curl_llist_destroy(h->table[i], NULL);
          h->table[i] = NULL;
        }
        free(h->table);
        h->table = NULL;
        h->slots = 0;
        return 1; /* failure */
      }
    }
    return 0; /* fine */
  }
  else {
    h->slots = 0;
    return 1; /* failure */
  }
}